

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

TextureFormat sglr::getStencilFormat(int stencilBits)

{
  TestError *this;
  TextureFormat TStack_10;
  int stencilBits_local;
  
  switch(stencilBits) {
  case 8:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,S,UNSIGNED_INT8);
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Can\'t map depth buffer format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
               ,0xd9);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case 0x10:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,S,UNSIGNED_INT16);
    break;
  case 0x18:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,S,UNSIGNED_INT_24_8);
    break;
  case 0x20:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,S,UNSIGNED_INT32);
  }
  return TStack_10;
}

Assistant:

tcu::TextureFormat getStencilFormat (int stencilBits)
{
	switch (stencilBits)
	{
		case 8:		return tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT8);
		case 16:	return tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT16);
		case 24:	return tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT_24_8);
		case 32:	return tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT32);
		default:
			TCU_FAIL("Can't map depth buffer format");
	}
}